

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash.h
# Opt level: O2

void __thiscall
highwayhash::HighwayHashCatT<2U>::Finalize<unsigned_long[4]>
          (HighwayHashCatT<2U> *this,unsigned_long (*hash) [4])

{
  HHStateT<2U> state_copy;
  HHStateSSE41 local_88;
  
  local_88.v0L.v_[0] = (this->state_).v0L.v_[0];
  local_88.v0L.v_[1] = (this->state_).v0L.v_[1];
  local_88.v0H.v_[0] = (this->state_).v0H.v_[0];
  local_88.v0H.v_[1] = (this->state_).v0H.v_[1];
  local_88.v1L.v_[0] = (this->state_).v1L.v_[0];
  local_88.v1L.v_[1] = (this->state_).v1L.v_[1];
  local_88.v1H.v_[0] = (this->state_).v1H.v_[0];
  local_88.v1H.v_[1] = (this->state_).v1H.v_[1];
  local_88.mul0L.v_[0] = (this->state_).mul0L.v_[0];
  local_88.mul0L.v_[1] = (this->state_).mul0L.v_[1];
  local_88.mul0H.v_[0] = (this->state_).mul0H.v_[0];
  local_88.mul0H.v_[1] = (this->state_).mul0H.v_[1];
  local_88.mul1L.v_[0] = (this->state_).mul1L.v_[0];
  local_88.mul1L.v_[1] = (this->state_).mul1L.v_[1];
  local_88.mul1H.v_[0] = (this->state_).mul1H.v_[0];
  local_88.mul1H.v_[1] = (this->state_).mul1H.v_[1];
  if (this->buffer_usage_ != 0) {
    SSE41::HHStateSSE41::UpdateRemainder(&local_88,this->buffer_,this->buffer_usage_);
  }
  SSE41::HHStateSSE41::Finalize(&local_88,(HHResult256 *)hash);
  return;
}

Assistant:

HH_INLINE void Finalize(Result* HH_RESTRICT hash) const {
    // BeginIACA();
    HHStateT<Target> state_copy = state_;
    const size_t buffer_usage = buffer_usage_;
    if (HH_LIKELY(buffer_usage != 0)) {
      state_copy.UpdateRemainder(buffer_, buffer_usage);
    }
    state_copy.Finalize(hash);
    // EndIACA();
  }